

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O2

void __thiscall t_lua_generator::init_generator(t_lua_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  int __oflag;
  int __oflag_00;
  t_program *extraout_RDX;
  t_program *extraout_RDX_00;
  t_program *program;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string f_types_name;
  string local_a0;
  string cur_namespace;
  string f_consts_name;
  string outdir;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&outdir,this);
  iVar1 = mkdir(outdir._M_dataplus._M_p,0x1ff);
  program = extraout_RDX;
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    program = extraout_RDX_00;
    if (*piVar2 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&f_consts_name,outdir._M_dataplus._M_p,(allocator *)&f_types_name);
      std::operator+(&cur_namespace,&f_consts_name,": ");
      __rhs = strerror(*piVar2);
      std::operator+(__return_storage_ptr__,&cur_namespace,__rhs);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  get_namespace_abi_cxx11_
            (&cur_namespace,
             (t_lua_generator *)(this->super_t_oop_generator).super_t_generator.program_,program);
  std::operator+(&f_types_name,&outdir,&cur_namespace);
  std::operator+(&f_consts_name,&f_types_name,"constants.lua");
  std::__cxx11::string::~string((string *)&f_types_name);
  std::__cxx11::string::string
            ((string *)&f_types_name,f_consts_name._M_dataplus._M_p,(allocator *)&local_e0);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_consts_,(char *)&f_types_name,__oflag);
  std::__cxx11::string::~string((string *)&f_types_name);
  std::operator+(&local_e0,&outdir,&cur_namespace);
  std::operator+(&f_types_name,&local_e0,"ttypes.lua");
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string
            ((string *)&local_e0,f_types_name._M_dataplus._M_p,(allocator *)&local_a0);
  this_00 = &this->f_types_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_00,(char *)&local_e0,__oflag_00);
  std::__cxx11::string::~string((string *)&local_e0);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_e0,this);
  poVar3 = std::operator<<((ostream *)&this->f_consts_,(string *)&local_e0);
  lua_includes_abi_cxx11_(&local_a0,this);
  std::operator<<(poVar3,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_e0,this);
  poVar3 = std::operator<<((ostream *)this_00,(string *)&local_e0);
  lua_includes_abi_cxx11_(&local_a0,this);
  std::operator<<(poVar3,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (this->gen_requires_ == true) {
    poVar3 = std::operator<<((ostream *)this_00,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"require \'");
    poVar3 = std::operator<<(poVar3,(string *)&cur_namespace);
    std::operator<<(poVar3,"constants\'");
  }
  std::__cxx11::string::~string((string *)&f_types_name);
  std::__cxx11::string::~string((string *)&f_consts_name);
  std::__cxx11::string::~string((string *)&cur_namespace);
  std::__cxx11::string::~string((string *)&outdir);
  return;
}

Assistant:

void t_lua_generator::init_generator() {
  // Make output directory
  string outdir = get_out_dir();
  MKDIR(outdir.c_str());

  // Make output files
  string cur_namespace = get_namespace(program_);
  string f_consts_name = outdir + cur_namespace + "constants.lua";
  f_consts_.open(f_consts_name.c_str());
  string f_types_name = outdir + cur_namespace + "ttypes.lua";
  f_types_.open(f_types_name.c_str());

  // Add headers
  f_consts_ << autogen_comment() << lua_includes();
  f_types_ << autogen_comment() << lua_includes();
  if (gen_requires_) {
    f_types_ << endl << "require '" << cur_namespace << "constants'";
  }
}